

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetworkLayerValidator.cpp
# Opt level: O2

Result * __thiscall
CoreML::NeuralNetworkSpecValidator::validateSliceStaticLayer
          (Result *__return_storage_ptr__,NeuralNetworkSpecValidator *this,NeuralNetworkLayer *layer
          )

{
  bool bVar1;
  SliceStaticLayerParams *pSVar2;
  Result *_result;
  string err;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  validateInputCount(__return_storage_ptr__,layer,1,1);
  bVar1 = Result::good(__return_storage_ptr__);
  if (bVar1) {
    std::__cxx11::string::~string((string *)&__return_storage_ptr__->m_message);
    validateOutputCount(__return_storage_ptr__,layer,1,1);
    bVar1 = Result::good(__return_storage_ptr__);
    if (bVar1) {
      std::__cxx11::string::~string((string *)&__return_storage_ptr__->m_message);
      pSVar2 = Specification::NeuralNetworkLayer::slicestatic(layer);
      if ((pSVar2->beginids_).current_size_ == 0) {
        std::operator+(&local_38,"Begin IDs are required parameters for \'",(layer->name_).ptr_);
        std::operator+(&err,&local_38,"\' layer.");
        std::__cxx11::string::~string((string *)&local_38);
        Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&err);
      }
      else if ((pSVar2->endids_).current_size_ == 0) {
        std::operator+(&local_38,"End IDs are required parameters for \'",(layer->name_).ptr_);
        std::operator+(&err,&local_38,"\' layer.");
        std::__cxx11::string::~string((string *)&local_38);
        Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&err);
      }
      else if ((pSVar2->strides_).current_size_ == 0) {
        std::operator+(&local_38,"Strides are required parameters for \'",(layer->name_).ptr_);
        std::operator+(&err,&local_38,"\' layer.");
        std::__cxx11::string::~string((string *)&local_38);
        Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&err);
      }
      else if ((pSVar2->beginmasks_).current_size_ == 0) {
        std::operator+(&local_38,"Begin masks are required parameters for \'",(layer->name_).ptr_);
        std::operator+(&err,&local_38,"\' layer.");
        std::__cxx11::string::~string((string *)&local_38);
        Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&err);
      }
      else {
        if ((pSVar2->endmasks_).current_size_ != 0) {
          Result::Result(__return_storage_ptr__);
          return __return_storage_ptr__;
        }
        std::operator+(&local_38,"End masks are required parameters for \'",(layer->name_).ptr_);
        std::operator+(&err,&local_38,"\' layer.");
        std::__cxx11::string::~string((string *)&local_38);
        Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&err);
      }
      std::__cxx11::string::~string((string *)&err);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Result NeuralNetworkSpecValidator::validateSliceStaticLayer(const Specification::NeuralNetworkLayer& layer) {
    HANDLE_RESULT_AND_RETURN_ON_ERROR(validateInputCount(layer, 1, 1));
    HANDLE_RESULT_AND_RETURN_ON_ERROR(validateOutputCount(layer, 1, 1));

    const auto& params = layer.slicestatic();
    // check for required parameters
    if (params.beginids_size() == 0) {
        const std::string err = "Begin IDs are required parameters for '" + layer.name() + "' layer.";
        return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
    }
    if (params.endids_size() == 0) {
        const std::string err = "End IDs are required parameters for '" + layer.name() + "' layer.";
        return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
    }
    if (params.strides_size() == 0) {
        const std::string err = "Strides are required parameters for '" + layer.name() + "' layer.";
        return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
    }
    if (params.beginmasks_size() == 0) {
        const std::string err = "Begin masks are required parameters for '" + layer.name() + "' layer.";
        return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
    }
    if (params.endmasks_size() == 0) {
        const std::string err = "End masks are required parameters for '" + layer.name() + "' layer.";
        return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
    }
    return Result();
}